

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

SDKResult __thiscall
tonk::SDKConnection::Send(SDKConnection *this,void *data,uint64_t bytes,uint32_t channel)

{
  TonkResult result;
  undefined4 in_ECX;
  void *in_RDX;
  TonkConnection in_RSI;
  SDKResult sdkResult;
  undefined4 in_stack_ffffffffffffffd8;
  SDKResult local_4;
  
  result = tonk_send(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0);
  SDKResult::SDKResult(&local_4,result);
  return (SDKResult)local_4.Result;
}

Assistant:

SDKResult SDKConnection::Send(
    const void*               data, ///< [in] Pointer to message data
    uint64_t                 bytes, ///< [in] Message bytes
    uint32_t               channel  ///< [in] Channel to attach to message
)
{
    SDKResult sdkResult = tonk_send(
        MyConnection,
        data,
        bytes,
        channel);
    return sdkResult;
}